

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow *window)

{
  float fVar1;
  float local_3c;
  float local_34;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 padding;
  ImGuiWindow *window_local;
  ImRect r_screen;
  
  local_28 = (GImGui->Style).DisplaySafeAreaPadding;
  padding = (ImVec2)window;
  _window_local = GetViewportRect();
  fVar1 = ImRect::GetWidth((ImRect *)&window_local);
  if (fVar1 <= local_28.x * 2.0) {
    local_34 = 0.0;
  }
  else {
    local_34 = -local_28.x;
  }
  fVar1 = ImRect::GetHeight((ImRect *)&window_local);
  if (fVar1 <= local_28.y * 2.0) {
    local_3c = 0.0;
  }
  else {
    local_3c = -local_28.y;
  }
  ImVec2::ImVec2(&local_30,local_34,local_3c);
  ImRect::Expand((ImRect *)&window_local,&local_30);
  return _window_local;
}

Assistant:

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow* window)
{
    IM_UNUSED(window);
    ImVec2 padding = GImGui->Style.DisplaySafeAreaPadding;
    ImRect r_screen = GetViewportRect();
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}